

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

tmbchar ParseTagName(TidyDocImpl *doc)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Lexer *lexer;
  tmbstr ptVar4;
  uint uVar5;
  Bool BVar6;
  
  lexer = doc->lexer;
  iVar2 = *(int *)((doc->config).value + 0x18);
  if (iVar2 == 0) {
    ptVar4 = lexer->lexbuf;
    uVar3 = lexer->txtstart;
    cVar1 = ptVar4[uVar3];
    if ((-1 < cVar1) && ((lexmap[(uint)(int)cVar1] & 0x40) != 0)) {
      uVar5 = prvTidyToLower((int)cVar1);
      ptVar4[uVar3] = (tmbchar)uVar5;
    }
  }
  while (uVar5 = prvTidyReadChar(doc->docIn), uVar5 != 0xffffffff) {
    if (iVar2 == 0) {
      if ((0x7f < uVar5) || ((lexmap[uVar5] & 4) == 0)) break;
      if ((lexmap[uVar5] & 0x40) != 0) {
        uVar5 = prvTidyToLower(uVar5);
      }
    }
    else {
      BVar6 = prvTidyIsXMLNamechar(uVar5);
      if (BVar6 == no) break;
    }
    prvTidyAddCharToLexer(lexer,uVar5);
  }
  lexer->txtend = lexer->lexsize;
  return (tmbchar)uVar5;
}

Assistant:

static tmbchar ParseTagName( TidyDocImpl* doc )
{
    Lexer *lexer = doc->lexer;
    uint c = lexer->lexbuf[ lexer->txtstart ];
    Bool xml = cfgBool(doc, TidyXmlTags);

    /* fold case of first character in buffer */
    if (!xml && TY_(IsUpper)(c))
        lexer->lexbuf[lexer->txtstart] = (tmbchar) TY_(ToLower)(c);

    while ((c = TY_(ReadChar)(doc->docIn)) != EndOfStream)
    {
        if ((!xml && !TY_(IsNamechar)(c)) ||
            (xml && !TY_(IsXMLNamechar)(c)))
            break;

        /* fold case of subsequent characters */
        if (!xml && TY_(IsUpper)(c))
             c = TY_(ToLower)(c);

        TY_(AddCharToLexer)(lexer, c);
    }

    lexer->txtend = lexer->lexsize;
    return (tmbchar) c;
}